

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>
          (buffer_appender<char> out,big_decimal_fp *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  buffer_appender<char> bVar4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  buffer<char> *buf;
  int num_zeros;
  sign_t sign;
  int significand_size;
  anon_class_40_7_ef14d3db write;
  char *significand;
  int exp;
  undefined1 local_8d [5];
  sign_t local_88;
  int local_84;
  anon_class_56_7_a2a26a24 local_80;
  char *******local_48;
  int local_3c;
  float_specs local_38;
  
  local_80.significand = (char **)fp->significand;
  local_84 = fp->significand_size;
  uVar3 = fspecs._4_4_;
  local_88 = uVar3 >> 8 & 0xff;
  uVar9 = (ulong)((uint)(local_88 != none) + local_84);
  uVar13 = fp->exponent;
  iVar12 = uVar13 + local_84;
  uVar5 = fspecs.precision;
  local_8d[0] = decimal_point;
  local_48 = (char *******)local_80.significand;
  local_38 = fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_00116b30:
    iVar8 = uVar13 + local_84 + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar6 = 0;
      uVar11 = (ulong)(byte)decimal_point;
      if (local_84 == 1) {
        uVar11 = uVar6;
      }
      cVar10 = (char)uVar11;
    }
    else {
      uVar6 = 0;
      if (0 < (int)(uVar5 - local_84)) {
        uVar6 = (ulong)(uVar5 - local_84);
      }
      uVar9 = uVar9 + uVar6;
      cVar10 = decimal_point;
    }
    iVar2 = 1 - iVar12;
    if (0 < iVar12) {
      iVar2 = iVar8;
    }
    lVar14 = 2;
    if (99 < iVar2) {
      lVar14 = (ulong)(999 < iVar2) + 3;
    }
    uVar9 = (3 - (ulong)(cVar10 == '\0')) + uVar9 + lVar14;
    local_80.sign = (sign_t *)(CONCAT44(local_80.sign._4_4_,uVar3 >> 8) & 0xffffffff000000ff);
    local_80.significand_size._0_5_ = CONCAT14(cVar10,local_84);
    local_80.fp = (big_decimal_fp *)
                  (CONCAT35(local_80.fp._5_3_,CONCAT14(((uVar3 >> 0x10 & 1) == 0) << 5,(int)uVar6))
                  | 0x4500000000);
    local_80.fspecs = (float_specs *)CONCAT44(local_80.fspecs._4_4_,iVar8);
    uVar6 = (ulong)specs->width;
    if ((long)uVar6 < 1) {
      uVar9 = uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container + 0x10);
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) < uVar9) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar9);
      }
      bVar4 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
              ::anon_class_40_7_ef14d3db::operator()
                        ((anon_class_40_7_ef14d3db *)&local_80,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      return (buffer_appender<char>)
             bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar11 = 0;
    if (uVar9 <= uVar6) {
      uVar11 = uVar6 - uVar9;
    }
    bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    uVar9 = uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10) + (specs->fill).size_ * uVar11;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar9) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar9);
    }
    uVar9 = uVar11 >> (bVar1 & 0x3f);
    bVar4 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                   ::anon_class_40_7_ef14d3db::operator()
                             ((anon_class_40_7_ef14d3db *)&local_80,
                              bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    goto LAB_00116dd6;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar7 = 0x10;
    if (0 < (int)uVar5) {
      uVar7 = uVar5;
    }
    if ((iVar12 < -3) || ((int)uVar7 < iVar12)) goto LAB_00116b30;
  }
  local_3c = iVar12;
  if ((int)uVar13 < 0) {
    if (iVar12 < 1) {
      uVar13 = -iVar12;
      local_8d._1_4_ = uVar13;
      if (SBORROW4(uVar5,uVar13) != (int)(uVar5 + iVar12) < 0) {
        local_8d._1_4_ = uVar5;
      }
      if ((int)uVar5 < 0) {
        local_8d._1_4_ = uVar13;
      }
      if (local_84 != 0) {
        local_8d._1_4_ = uVar13;
      }
      uVar9 = (local_8d._1_4_ + 2) + uVar9;
      local_80.sign = &local_88;
      local_80.significand_size = &local_84;
      local_80.fp = (big_decimal_fp *)&local_38;
      local_80.fspecs = (float_specs *)local_8d;
      local_80.decimal_point = (char *)&local_48;
      uVar11 = 0;
      if (uVar9 <= (uint)specs->width) {
        uVar11 = (uint)specs->width - uVar9;
      }
      bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)specs->field_0x9 & 0xf));
      uVar9 = uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container + 0x10) + (specs->fill).size_ * uVar11;
      local_80.significand = (char **)(local_8d + 1);
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) < uVar9) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar9);
      }
      uVar9 = uVar11 >> (bVar1 & 0x3f);
      bVar4 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
      it.container = (buffer<char> *)
                     write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                     ::anon_class_48_6_9afe1116::operator()
                               ((anon_class_48_6_9afe1116 *)&local_80,
                                bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container);
    }
    else {
      local_8d._1_4_ = uVar5 - local_84 & (int)(uVar3 << 0xb) >> 0x1f;
      local_80.decimal_point = local_8d + 1;
      uVar6 = (ulong)(uint)local_8d._1_4_;
      if ((int)local_8d._1_4_ < 1) {
        uVar6 = 0;
      }
      uVar9 = uVar6 + 1 + uVar9;
      local_80.sign = &local_88;
      local_80.significand_size = &local_84;
      local_80.fp = (big_decimal_fp *)&local_3c;
      local_80.fspecs = (float_specs *)local_8d;
      uVar11 = 0;
      if (uVar9 <= (uint)specs->width) {
        uVar11 = (uint)specs->width - uVar9;
      }
      bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)specs->field_0x9 & 0xf));
      local_80.significand = (char **)&local_48;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) <
          uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10) + (specs->fill).size_ * uVar11) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar9 = uVar11 >> (bVar1 & 0x3f);
      bVar4 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
      it.container = (buffer<char> *)
                     write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                     ::anon_class_48_6_48d028d1::operator()
                               ((anon_class_48_6_48d028d1 *)&local_80,
                                bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container);
    }
    goto LAB_00116dd6;
  }
  uVar9 = uVar9 + uVar13;
  local_8d._1_4_ = uVar5 - iVar12;
  if ((uVar3 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_8d._1_4_) {
      if ((int)local_8d._1_4_ < 1) goto LAB_00116d31;
    }
    else {
      local_8d._1_4_ = 1;
    }
    uVar9 = uVar9 + (uint)local_8d._1_4_;
  }
LAB_00116d31:
  local_80.sign = &local_88;
  local_80.significand_size = &local_84;
  local_80.fspecs = &local_38;
  local_80.decimal_point = local_8d;
  local_80.num_zeros = (int *)(local_8d + 1);
  uVar11 = 0;
  if (uVar9 <= (uint)specs->width) {
    uVar11 = (uint)specs->width - uVar9;
  }
  bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)specs->field_0x9 & 0xf));
  local_80.significand = (char **)&local_48;
  local_80.fp = fp;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + (specs->fill).size_ * uVar11) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar9 = uVar11 >> (bVar1 & 0x3f);
  bVar4 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                 ::anon_class_56_7_a2a26a24::operator()
                           (&local_80,
                            bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_00116dd6:
  bVar4 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar11 - uVar9,&specs->fill);
  return (buffer_appender<char>)
         bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}